

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::SamplerHandle::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,SamplerHandle *this,int n,Allocator alloc)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  uVar2 = (uint)(ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x30 < 5) {
    if (uVar2 < 3) {
      if (uVar2 == 2) {
        StratifiedSampler::Clone
                  (__return_storage_ptr__,(StratifiedSampler *)(uVar1 & 0xffffffffffff),n,alloc);
      }
      else {
        RandomSampler::Clone
                  (__return_storage_ptr__,(RandomSampler *)(uVar1 & 0xffffffffffff),n,alloc);
      }
    }
    else if ((uVar2 & 6) == 2) {
      HaltonSampler::Clone(__return_storage_ptr__,(HaltonSampler *)(uVar1 & 0xffffffffffff),n,alloc)
      ;
    }
    else {
      PaddedSobolSampler::Clone
                (__return_storage_ptr__,(PaddedSobolSampler *)(uVar1 & 0xffffffffffff),n,alloc);
    }
  }
  else {
    uVar2 = uVar2 - 4;
    if (uVar2 < 3) {
      if (uVar2 == 2) {
        ZSobolSampler::Clone
                  (__return_storage_ptr__,(ZSobolSampler *)(uVar1 & 0xffffffffffff),n,alloc);
      }
      else {
        SobolSampler::Clone(__return_storage_ptr__,(SobolSampler *)(uVar1 & 0xffffffffffff),n,alloc)
        ;
      }
    }
    else {
      if ((uVar2 & 0x7ffffffe) != 2) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                 ,0x187,"MLTSampler::Clone() is not implemented");
      }
      PMJ02BNSampler::Clone
                (__return_storage_ptr__,(PMJ02BNSampler *)(uVar1 & 0xffffffffffff),n,alloc);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> SamplerHandle::Clone(int n, Allocator alloc) {
    auto clone = [&](auto ptr) { return ptr->Clone(n, alloc); };
    return DispatchCPU(clone);
}